

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

unsigned_long get_inc(_mdi *mdi,_note *nte)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)nte->patch->note;
  uVar2 = (ulong)(nte->noteid & 0x7f);
  if (uVar4 != 0) {
    uVar2 = uVar4;
  }
  lVar3 = uVar2 * 100 + mdi->channel[nte->noteid >> 8].pitch_adjust;
  if (0x319b < lVar3) {
    lVar3 = 0x319c;
  }
  if (lVar3 < 1) {
    lVar3 = 0;
  }
  bVar1 = 10U - (char)((ushort)lVar3 / 0x4b0) & 0x1f;
  return ((CONCAT44(0 >> bVar1,freq_table[(ushort)((ushort)lVar3 % 0x4b0)] >> bVar1) /
           (ulong)((uint)_WM_SampleRate * 100 >> 10) & 0xffffffff) << 10) /
         (ulong)nte->sample->inc_div;
}

Assistant:

static inline unsigned long int get_inc(struct _mdi *mdi, struct _note *nte) {
	int ch = nte->noteid >> 8;
	signed long int note_f;
	unsigned long int freq;

	if (nte->patch->note != 0) {
		note_f = nte->patch->note * 100;
	} else {
		note_f = (nte->noteid & 0x7f) * 100;
	}
	note_f += mdi->channel[ch].pitch_adjust;
	if (note_f < 0) {
		note_f = 0;
	} else if (note_f > 12700) {
		note_f = 12700;
	}
	freq = freq_table[(note_f % 1200)] >> (10 - (note_f / 1200));
	return (((freq / ((_WM_SampleRate * 100) / 1024)) * 1024
			/ nte->sample->inc_div));
}